

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O3

string * __thiscall
t_java_generator::async_function_call_arglist_abi_cxx11_
          (string *__return_storage_ptr__,t_java_generator *this,t_function *tfunc,
          bool use_base_method,bool include_types)

{
  t_struct *tstruct;
  long *plVar1;
  undefined8 *puVar2;
  undefined7 in_register_00000009;
  long *plVar3;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,"","",CONCAT71(in_register_00000009,use_base_method));
  tstruct = tfunc->arglist_;
  if ((tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    argument_list_abi_cxx11_(&local_50,this,tstruct,include_types);
    plVar1 = (long *)std::__cxx11::string::append((char *)&local_50);
    plVar3 = plVar1 + 2;
    if ((long *)*plVar1 == plVar3) {
      local_68 = *plVar3;
      lStack_60 = plVar1[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar3;
      local_78 = (long *)*plVar1;
    }
    local_70 = plVar1[1];
    *plVar1 = (long)plVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if (include_types) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    type_name_abi_cxx11_(&local_50,this,tfunc->returntype_,true,false,false,false);
    puVar2 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
    plVar1 = puVar2 + 2;
    if ((long *)*puVar2 == plVar1) {
      local_68 = *plVar1;
      lStack_60 = puVar2[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar1;
      local_78 = (long *)*puVar2;
    }
    local_70 = puVar2[1];
    *puVar2 = plVar1;
    puVar2[1] = 0;
    *(undefined1 *)(puVar2 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string t_java_generator::async_function_call_arglist(t_function* tfunc,
                                                     bool use_base_method,
                                                     bool include_types) {
  (void)use_base_method;
  std::string arglist = "";
  if (tfunc->get_arglist()->get_members().size() > 0) {
    arglist = argument_list(tfunc->get_arglist(), include_types) + ", ";
  }

  if (include_types) {
    arglist += "org.apache.thrift.async.AsyncMethodCallback<";
    arglist += type_name(tfunc->get_returntype(), true) + "> ";
  }
  arglist += "resultHandler";

  return arglist;
}